

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

int matras_touch_reserve(matras *m,int count)

{
  int max_extents_required;
  _Bool root_is_to_be_copied;
  int count_local;
  matras *m_local;
  
  if (-1 < count) {
    if (count == 0) {
      m_local._4_4_ = 0;
    }
    else if ((m->head).prev_view == (matras_view *)0x0) {
      m_local._4_4_ = 0;
    }
    else if (((m->head).prev_view)->block_count == 0) {
      m_local._4_4_ = 0;
    }
    else {
      m_local._4_4_ =
           matras_allocator_reserve
                     (m->allocator,count * 2 + (uint)((m->head).root == ((m->head).prev_view)->root)
                     );
    }
    return m_local._4_4_;
  }
  __assert_fail("count >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                ,0x159,"int matras_touch_reserve(struct matras *, int)");
}

Assistant:

int
matras_touch_reserve(struct matras *m, int count)
{
	assert(count >= 0);

	/* No `matras_touch` calls planned. */
	if (count == 0)
		return 0;

	/* No view opened, the `matras_touch` will be a no-op. */
	if (!m->head.prev_view)
		return 0;

	/* The previous view is empty, the `matras_touch` will be a no-op. */
	if (m->head.prev_view->block_count == 0)
		return 0;

	/* The root is only copied once - on the first touch. */
	bool root_is_to_be_copied = m->head.root == m->head.prev_view->root;

	/* We have extents on 2 levels to possibly be copied after root. */
	int max_extents_required = count * 2 + root_is_to_be_copied;
	return matras_allocator_reserve(m->allocator, max_extents_required);
}